

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O1

void h2v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  JDIMENSION JVar1;
  JSAMPARRAY ppJVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  JSAMPROW pJVar10;
  int iVar11;
  int iVar12;
  JSAMPROW pJVar13;
  bool bVar14;
  
  if (0 < cinfo->max_v_samp_factor) {
    ppJVar2 = *output_data_ptr;
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar6 = (long)(int)lVar6;
      iVar7 = 0;
      do {
        pbVar3 = input_data[lVar5];
        pbVar4 = (input_data + lVar5)[(ulong)(iVar7 != 0) * 2 + -1];
        pJVar10 = ppJVar2[lVar6];
        iVar11 = (uint)*pbVar4 + (uint)*pbVar3 + (uint)*pbVar3 * 2;
        iVar8 = (uint)pbVar4[1] + (uint)pbVar3[1] + (uint)pbVar3[1] * 2;
        *pJVar10 = (JSAMPLE)(iVar11 * 4 + 8U >> 4);
        pJVar10[1] = (JSAMPLE)(iVar11 * 3 + iVar8 + 7U >> 4);
        JVar1 = compptr->downsampled_width;
        pJVar13 = pJVar10 + 2;
        if (JVar1 != 2) {
          lVar9 = 2;
          iVar12 = iVar11;
          do {
            iVar11 = iVar8;
            pJVar10 = pJVar13;
            iVar8 = (uint)pbVar4[lVar9] + (uint)pbVar3[lVar9] + (uint)pbVar3[lVar9] * 2;
            *pJVar10 = (JSAMPLE)(iVar12 + iVar11 * 3 + 8U >> 4);
            pJVar10[1] = (JSAMPLE)(iVar11 * 3 + iVar8 + 7U >> 4);
            pJVar13 = pJVar10 + 2;
            lVar9 = lVar9 + 1;
            iVar12 = iVar11;
          } while (JVar1 != (JDIMENSION)lVar9);
        }
        lVar6 = lVar6 + 1;
        *pJVar13 = (JSAMPLE)(iVar8 * 3 + iVar11 + 8U >> 4);
        pJVar10[3] = (JSAMPLE)(iVar8 * 4 + 7U >> 4);
        bVar14 = iVar7 == 0;
        iVar7 = iVar7 + 1;
      } while (bVar14);
      lVar5 = lVar5 + 1;
    } while ((int)lVar6 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  register int thiscolsum, lastcolsum, nextcolsum;
#else
  register JLONG thiscolsum, lastcolsum, nextcolsum;
#endif
  register JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0)               /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
      else                      /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
      outptr = output_data[outrow++];

      /* Special case for first column */
      thiscolsum = (*inptr0++) * 3 + (*inptr1++);
      nextcolsum = (*inptr0++) * 3 + (*inptr1++);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
      lastcolsum = thiscolsum;  thiscolsum = nextcolsum;

      for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
        /* General case: 3/4 * nearer pixel + 1/4 * further pixel in each */
        /* dimension, thus 9/16, 3/16, 3/16, 1/16 overall */
        nextcolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
        lastcolsum = thiscolsum;  thiscolsum = nextcolsum;
      }

      /* Special case for last column */
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 7) >> 4);
    }
    inrow++;
  }
}